

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O2

void Lf_ManPrintQuit(Lf_Man_t *p,Gia_Man_t *pNew)

{
  int iVar1;
  uint uVar2;
  Vec_Mem_t *pVVar3;
  Jf_Par_t *pJVar4;
  Vec_Int_t *p_00;
  float fVar5;
  float fVar6;
  float fVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  abctime aVar11;
  abctime time;
  char *pStr;
  int i;
  ulong uVar12;
  double dVar13;
  undefined1 auVar14 [16];
  float fVar15;
  float fVar16;
  int CountOver [2];
  
  dVar13 = Gia_ManMemory(p->pGia);
  iVar10 = p->pGia->nObjs;
  iVar8 = Gia_ManAndNotBufNum(p->pGia);
  pVVar3 = p->vTtMem;
  fVar16 = 0.0;
  iVar9 = 1;
  fVar15 = 0.0;
  if (pVVar3 != (Vec_Mem_t *)0x0) {
    fVar15 = ((float)pVVar3->nPageAlloc * 8.0 +
              (float)(pVVar3->iPage + 1) *
              (float)(1 << ((byte)pVVar3->LogPageSze & 0x1f)) * (float)pVVar3->nEntrySize * 8.0 +
             48.0) * 9.536743e-07;
  }
  if (pNew->vMapping != (Vec_Int_t *)0x0) {
    iVar1 = pNew->vMapping->nCap;
    auVar14._8_4_ = iVar1 >> 0x1f;
    auVar14._0_8_ = (long)iVar1;
    auVar14._12_4_ = 0x45300000;
    fVar16 = (float)((((auVar14._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,iVar1) - 4503599627370496.0)) * 4.0 + 16.0) *
                    9.5367431640625e-07);
  }
  if ((p->CutCount[0] == 0.0) && (!NAN(p->CutCount[0]))) {
    p->CutCount[0] = 1.0;
  }
  pJVar4 = p->pPars;
  if (pJVar4->fVerbose != 0) {
    fVar6 = (float)iVar8 * 32.0 * 9.536743e-07 +
            (float)((p->vStoreOld).vPages.nSize + (p->vFreePages).nSize) *
            (float)((p->vStoreOld).MaskPage + 1) * 9.536743e-07;
    fVar5 = (float)(iVar8 * 3 + iVar10 * 2) * 4.0 * 9.536743e-07;
    fVar7 = (float)(p->vMemSets).nSize * (float)p->nSetWords * 8.0 * 4096.0 * 9.536743e-07;
    printf("CutPair = %.0f  ");
    printf("Merge = %.0f (%.2f %%)  ",p->CutCount[1],(p->CutCount[1] * 100.0) / p->CutCount[0]);
    printf("Eval = %.0f (%.2f %%)  ",p->CutCount[2],(p->CutCount[2] * 100.0) / p->CutCount[0]);
    printf("Cut = %.0f (%.2f %%)  ",p->CutCount[3],(p->CutCount[3] * 100.0) / p->CutCount[0]);
    putchar(10);
    printf("Gia = %.2f MB  ",(double)(float)(dVar13 * 9.5367431640625e-07));
    printf("Man = %.2f MB  ",(double)fVar5);
    printf("Best = %.2f MB  ",(double)fVar6);
    printf("Front = %.2f MB   ",(double)fVar7);
    printf("Map = %.2f MB  ",(double)fVar16);
    printf("TT = %.2f MB  ",(double)fVar15);
    printf("Total = %.2f MB",
           (double)((float)(dVar13 * 9.5367431640625e-07) + fVar5 + fVar6 + fVar7 + fVar16 + fVar15)
          );
    putchar(10);
    for (uVar12 = 0; (long)uVar12 <= (long)p->pPars->nLutSize; uVar12 = uVar12 + 1) {
      printf("%d:%d  ",uVar12 & 0xffffffff,(ulong)(uint)p->nCutCounts[uVar12]);
    }
    uVar2 = p->nCutEqual;
    iVar10 = p->Iter;
    iVar9 = Gia_ManAndNotBufNum(p->pGia);
    printf("Equal = %d (%.0f %%) ",(((double)(int)uVar2 * 100.0) / (double)iVar10) / (double)iVar9,
           (ulong)uVar2);
    if (p->vTtMem != (Vec_Mem_t *)0x0) {
      printf("TT = %d (%.2f %%)  ",((double)p->vTtMem->nEntries * 100.0) / p->CutCount[2]);
    }
    if (p->pGia->pMuxes != (uint *)0x0) {
      if (p->nCutMux != 0) {
        printf("MuxTT = %d (%.0f %%) ",
               (((double)p->nCutMux * 100.0) / (double)p->Iter) / (double)p->pGia->nMuxes);
      }
    }
    putchar(10);
    printf("CoDrvs = %d (%.2f %%)  ",((double)p->nCoDrivers * 100.0) / (double)p->pGia->vCos->nSize)
    ;
    printf("CoInvs = %d (%.2f %%)  ",((double)p->nInverters * 100.0) / (double)p->pGia->vCos->nSize)
    ;
    uVar2 = p->nFrontMax;
    iVar10 = Gia_ManAndNum(p->pGia);
    printf("Front = %d (%.2f %%)  ",((double)(int)uVar2 * 100.0) / (double)iVar10,(ulong)uVar2);
    pStr = (char *)(ulong)(uint)p->nTimeFails;
    printf("TimeFails = %d   ");
    aVar11 = Abc_Clock();
    Abc_PrintTime((int)aVar11 - (int)p->clkStart,pStr,time);
    fflush(_stdout);
    return;
  }
  CountOver[0] = 0;
  CountOver[1] = 0;
  uVar12 = (long)pJVar4->nLutSize / 2 & 0xffffffff;
  if (pJVar4->fCutGroup == 0) {
    uVar12 = (ulong)(uint)pJVar4->nLutSize;
  }
  while( true ) {
    if (pNew->nObjs <= iVar9) break;
    iVar10 = Vec_IntEntry(pNew->vMapping,iVar9);
    if (iVar10 != 0) {
      p_00 = pNew->vMapping;
      iVar10 = Vec_IntEntry(p_00,iVar9);
      iVar10 = Vec_IntEntry(p_00,iVar10);
      CountOver[(int)uVar12 < iVar10] = CountOver[(int)uVar12 < iVar10] + 1;
    }
    iVar9 = iVar9 + 1;
  }
  if (p->pPars->fCutGroup != 0) {
    printf("Created %d regular %d-LUTs and %d dual %d-LUTs. The total of %d %d-LUTs.\n",
           (ulong)CountOver & 0xffffffff,uVar12,(ulong)(uint)CountOver[1],uVar12,
           (ulong)(uint)(CountOver[0] + CountOver[1] * 2),(int)uVar12);
  }
  return;
}

Assistant:

void Lf_ManPrintQuit( Lf_Man_t * p, Gia_Man_t * pNew )
{
    float MemGia   = Gia_ManMemory(p->pGia) / (1<<20);
    float MemMan   = 1.0 * sizeof(int) * (2 * Gia_ManObjNum(p->pGia) + 3 * Gia_ManAndNotBufNum(p->pGia)) / (1<<20); // offset, required, cutsets, maprefs, flowrefs
    float MemCutsB = 1.0 * (p->vStoreOld.MaskPage + 1) * (Vec_PtrSize(&p->vFreePages) + Vec_PtrSize(&p->vStoreOld.vPages)) / (1<<20) + 1.0 * sizeof(Lf_Bst_t) * Gia_ManAndNotBufNum(p->pGia) / (1<<20);
    float MemCutsF = 1.0 * sizeof(word) * p->nSetWords * (1<<LF_LOG_PAGE) * Vec_PtrSize(&p->vMemSets) / (1<<20);
    float MemTt    = p->vTtMem ? Vec_MemMemory(p->vTtMem) / (1<<20) : 0;
    float MemMap   = Vec_IntMemory(pNew->vMapping) / (1<<20);
    if ( p->CutCount[0] == 0 )
        p->CutCount[0] = 1;
    if ( !p->pPars->fVerbose )
    {
        int i, CountOver[2] = {0};
        int nLutSize = p->pPars->fCutGroup ? p->pPars->nLutSize/2 : p->pPars->nLutSize;
        Gia_ManForEachLut( pNew, i )
            CountOver[Gia_ObjLutSize(pNew, i) > nLutSize]++;
        if ( p->pPars->fCutGroup )
            printf( "Created %d regular %d-LUTs and %d dual %d-LUTs. The total of %d %d-LUTs.\n", 
            CountOver[0], nLutSize, CountOver[1], nLutSize, CountOver[0] + 2*CountOver[1], nLutSize );
        return;
    }
    printf( "CutPair = %.0f  ",         p->CutCount[0] );
    printf( "Merge = %.0f (%.2f %%)  ", p->CutCount[1], 100.0*p->CutCount[1]/p->CutCount[0] );
    printf( "Eval = %.0f (%.2f %%)  ",  p->CutCount[2], 100.0*p->CutCount[2]/p->CutCount[0] );
    printf( "Cut = %.0f (%.2f %%)  ",   p->CutCount[3], 100.0*p->CutCount[3]/p->CutCount[0] );
    printf( "\n" );
    printf( "Gia = %.2f MB  ",          MemGia );
    printf( "Man = %.2f MB  ",          MemMan ); 
    printf( "Best = %.2f MB  ",         MemCutsB );
    printf( "Front = %.2f MB   ",       MemCutsF );
    printf( "Map = %.2f MB  ",          MemMap ); 
    printf( "TT = %.2f MB  ",           MemTt ); 
    printf( "Total = %.2f MB",          MemGia + MemMan + MemCutsB + MemCutsF + MemMap + MemTt ); 
    printf( "\n" );
    if ( 1 )
    {
        int i;
        for ( i = 0; i <= p->pPars->nLutSize; i++ )
            printf( "%d:%d  ", i, p->nCutCounts[i] );
        printf( "Equal = %d (%.0f %%) ", p->nCutEqual, 100.0 * p->nCutEqual / p->Iter / Gia_ManAndNotBufNum(p->pGia) );
        if ( p->vTtMem )
            printf( "TT = %d (%.2f %%)  ", Vec_MemEntryNum(p->vTtMem), 100.0 * Vec_MemEntryNum(p->vTtMem) / p->CutCount[2] );
        if ( p->pGia->pMuxes && p->nCutMux )
            printf( "MuxTT = %d (%.0f %%) ", p->nCutMux, 100.0 * p->nCutMux / p->Iter / Gia_ManMuxNum(p->pGia) );
        printf( "\n" );
    }
    printf( "CoDrvs = %d (%.2f %%)  ",  p->nCoDrivers, 100.0*p->nCoDrivers/Gia_ManCoNum(p->pGia) );
    printf( "CoInvs = %d (%.2f %%)  ",  p->nInverters, 100.0*p->nInverters/Gia_ManCoNum(p->pGia) );
    printf( "Front = %d (%.2f %%)  ",   p->nFrontMax,  100.0*p->nFrontMax/Gia_ManAndNum(p->pGia) );
    printf( "TimeFails = %d   ",        p->nTimeFails );
    Abc_PrintTime( 1, "Time",    Abc_Clock() - p->clkStart );
    fflush( stdout );
}